

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_tooltip_end(nk_context *ctx)

{
  nk_window *pnVar1;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x6228,"void nk_tooltip_end(struct nk_context *)");
  }
  pnVar1 = ctx->current;
  if (pnVar1 != (nk_window *)0x0) {
    pnVar1->seq = pnVar1->seq - 1;
    nk_popup_close(ctx);
    nk_popup_end(ctx);
    return;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x6229,"void nk_tooltip_end(struct nk_context *)");
}

Assistant:

NK_API void
nk_tooltip_end(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current) return;
    ctx->current->seq--;
    nk_popup_close(ctx);
    nk_popup_end(ctx);
}